

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O0

void __thiscall FLispString::Add(FLispString *this,char *str,size_t len)

{
  size_t len_local;
  char *str_local;
  FLispString *this_local;
  
  CheckWrap(this,len + (this->NeedSpace & 1));
  if ((this->NeedSpace & 1U) != 0) {
    FString::operator<<(&this->Str,' ');
  }
  FString::AppendCStrPart(&this->Str,str,len);
  this->Column = len + (this->NeedSpace & 1) + this->Column;
  this->NeedSpace = true;
  return;
}

Assistant:

void Add(const char *str, size_t len)
	{
		CheckWrap(len + NeedSpace);
		if (NeedSpace)
		{
			Str << ' ';
		}
		Str.AppendCStrPart(str, len);
		Column += len + NeedSpace;
		NeedSpace = true;
	}